

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_attribute.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c3853::Json2Array<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>
::Json2Array(Json2Array<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType> *this,
            Value *value,
            vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
            *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_48 [8];
  RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType val;
  int i;
  vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.db_instance_id.field_2._12_4_ = 0; uVar1 = val.db_instance_id.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.db_instance_id.field_2._12_4_ = val.db_instance_id.field_2._12_4_ + 1) {
      aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType::
      RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType
                ((RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType *)local_48);
      value_00 = Json::Value::operator[](value,val.db_instance_id.field_2._12_4_);
      anon_unknown.dwarf_c3853::Json2Type
                (value_00,(RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType *)local_48);
      std::
      vector<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType>_>
      ::push_back(vec,(value_type *)local_48);
      aliyun::RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType::
      ~RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType
                ((RdsDescribeDBInstanceAttributeReadOnlyDBInstanceIdType *)local_48);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }